

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void OptimizeHuffmanForRle(int length,size_t *counts)

{
  void *__ptr;
  size_t sVar1;
  size_t *in_RSI;
  uint in_EDI;
  int count;
  int *good_for_rle;
  size_t limit;
  size_t sum;
  size_t symbol;
  int stride;
  int k;
  int i;
  int local_44;
  ulong local_38;
  long local_30;
  size_t local_28;
  int local_1c;
  int local_18;
  uint local_14;
  uint local_4;
  
  for (local_4 = in_EDI; -1 < (int)local_4; local_4 = local_4 - 1) {
    if (local_4 == 0) {
      return;
    }
    if (in_RSI[(int)(local_4 - 1)] != 0) break;
  }
  __ptr = malloc((ulong)local_4 << 2);
  for (local_14 = 0; (int)local_14 < (int)local_4; local_14 = local_14 + 1) {
    *(undefined4 *)((long)__ptr + (long)(int)local_14 * 4) = 0;
  }
  local_28 = *in_RSI;
  local_1c = 0;
  for (local_14 = 0; (int)local_14 < (int)(local_4 + 1); local_14 = local_14 + 1) {
    if ((local_14 == local_4) || (in_RSI[(int)local_14] != local_28)) {
      if (((local_28 == 0) && (4 < local_1c)) || ((local_28 != 0 && (6 < local_1c)))) {
        for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
          *(undefined4 *)((long)__ptr + (long)(int)((local_14 - local_18) + -1) * 4) = 1;
        }
      }
      local_1c = 1;
      if (local_14 != local_4) {
        local_28 = in_RSI[(int)local_14];
      }
    }
    else {
      local_1c = local_1c + 1;
    }
  }
  local_1c = 0;
  local_38 = *in_RSI;
  local_30 = 0;
  for (local_14 = 0; (int)local_14 < (int)(local_4 + 1); local_14 = local_14 + 1) {
    if (((local_14 == local_4) || (*(int *)((long)__ptr + (long)(int)local_14 * 4) != 0)) ||
       (sVar1 = AbsDiff(in_RSI[(int)local_14],local_38), 3 < sVar1)) {
      if ((3 < local_1c) || ((2 < local_1c && (local_30 == 0)))) {
        local_44 = (int)((ulong)(local_30 + local_1c / 2) / (ulong)(long)local_1c);
        if (local_44 < 1) {
          local_44 = 1;
        }
        if (local_30 == 0) {
          local_44 = 0;
        }
        for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
          in_RSI[(int)((local_14 - local_18) + -1)] = (long)local_44;
        }
      }
      local_1c = 0;
      local_30 = 0;
      if ((int)local_14 < (int)(local_4 - 3)) {
        local_38 = in_RSI[(int)local_14] + in_RSI[(int)(local_14 + 1)] + in_RSI[(int)(local_14 + 2)]
                   + in_RSI[(int)(local_14 + 3)] + 2 >> 2;
      }
      else if ((int)local_14 < (int)local_4) {
        local_38 = in_RSI[(int)local_14];
      }
      else {
        local_38 = 0;
      }
    }
    local_1c = local_1c + 1;
    if (local_14 != local_4) {
      local_30 = in_RSI[(int)local_14] + local_30;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void OptimizeHuffmanForRle(int length, size_t* counts) {
  int i, k, stride;
  size_t symbol, sum, limit;
  int* good_for_rle;

  /* 1) We don't want to touch the trailing zeros. We may break the
  rules of the format by adding more data in the distance codes. */
  for (; length >= 0; --length) {
    if (length == 0) {
      return;
    }
    if (counts[length - 1] != 0) {
      /* Now counts[0..length - 1] does not have trailing zeros. */
      break;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
  with an rle code.*/
  good_for_rle = (int*)malloc((unsigned)length * sizeof(int));
  for (i = 0; i < length; ++i) good_for_rle[i] = 0;

  /* Let's not spoil any of the existing good rle codes.
  Mark any seq of 0's that is longer than 5 as a good_for_rle.
  Mark any seq of non-0's that is longer than 7 as a good_for_rle.*/
  symbol = counts[0];
  stride = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || counts[i] != symbol) {
      if ((symbol == 0 && stride >= 5) || (symbol != 0 && stride >= 7)) {
        for (k = 0; k < stride; ++k) {
          good_for_rle[i - k - 1] = 1;
        }
      }
      stride = 1;
      if (i != length) {
        symbol = counts[i];
      }
    } else {
      ++stride;
    }
  }

  /* 3) Let's replace those population counts that lead to more rle codes. */
  stride = 0;
  limit = counts[0];
  sum = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || good_for_rle[i]
        /* Heuristic for selecting the stride ranges to collapse. */
        || AbsDiff(counts[i], limit) >= 4) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        /* The stride must end, collapse what we have, if we have enough (4). */
        int count = (sum + stride / 2) / stride;
        if (count < 1) count = 1;
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
          that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 3) {
        /* All interesting strides have a count of at least 4,
        at least when non-zeros. */
        limit = (counts[i] + counts[i + 1] +
                 counts[i + 2] + counts[i + 3] + 2) / 4;
      } else if (i < length) {
        limit = counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
    }
  }

  free(good_for_rle);
}